

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool __thiscall
absl::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  wchar_t *pwVar4;
  undefined8 extraout_RAX;
  byte bVar5;
  byte bVar6;
  long lVar7;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  CVar8;
  uint uVar9;
  FormatSinkImpl *this_00;
  string_view value;
  string_view v_00;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  Storage local_140;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_);
  local_140.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_0UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((long)v * 4);
  local_140.data_ =
       FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
                 (&local_140);
  CVar8.super_Storage<unsigned_long,_0UL,_false>.value = (Storage<unsigned_long,_0UL,_false>)0;
  if (v != (wchar_t *)0x0) {
    pwVar4 = (wchar_t *)0x0;
    bVar5 = 0;
    bVar2 = 0;
    do {
      if ((ulong)local_140.size_alloc_.
                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                 .super_Storage<unsigned_long,_0UL,_false>.value <=
          (ulong)CVar8.super_Storage<unsigned_long,_0UL,_false>.value) {
        _GLOBAL__N_1::ConvertStringArg();
        if (0x100 < (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value) {
          operator_delete(local_140.data_,
                          (ulong)local_140.size_alloc_.
                                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                                 .super_Storage<unsigned_long,_0UL,_false>.value);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar1 = *(uint *)(this + (long)pwVar4 * 4);
      bVar6 = (byte)uVar1;
      if (uVar1 < 0x80) {
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] = bVar6;
        lVar7 = 1;
      }
      else if (uVar1 < 0x800) {
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 6) | 0xc0;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
             bVar6 & 0x3f | 0x80;
        lVar7 = 2;
      }
      else if (uVar1 < 0xd800 || (uVar1 & 0xffffe000) == 0xe000) {
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 0xc) | 0xe0;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
             (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
             bVar6 & 0x3f | 0x80;
        lVar7 = 3;
      }
      else if (uVar1 - 0x10000 < 0x100000) {
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 0x12) | 0xf0;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
             (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
             (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 3] =
             bVar6 & 0x3f | 0x80;
        lVar7 = 4;
      }
      else if (uVar1 < 0xdc00) {
        bVar5 = bVar6 & 3;
        uVar9 = (uVar1 >> 6 & 0xf) + 1;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)uVar9 >> 2 | 0xf0;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
             (byte)(uVar1 >> 2) & 0xf | (byte)((uVar9 & 3) << 4) | 0x80;
        lVar7 = 2;
        bVar2 = 1;
      }
      else {
        if (!(bool)(uVar1 < 0xe000 & bVar2)) {
          bVar3 = false;
          goto LAB_00196f11;
        }
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 6) & 0xf | bVar5 << 4 | 0x80;
        local_140.data_[(long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
             bVar6 & 0x3f | 0x80;
        lVar7 = 2;
        bVar2 = 0;
        bVar5 = 0;
      }
      CVar8.super_Storage<unsigned_long,_0UL,_false>.value =
           (Storage<unsigned_long,_0UL,_false>)
           (lVar7 + (long)CVar8.super_Storage<unsigned_long,_0UL,_false>.value);
      pwVar4 = (wchar_t *)((long)pwVar4 + 1);
    } while (v != pwVar4);
  }
  bVar2 = (byte)(len >> 8);
  if (bVar2 == 0) {
    bVar3 = true;
    v_00._M_str = local_140.data_;
    v_00._M_len = (size_t)CVar8.super_Storage<unsigned_long,_0UL,_false>.value;
    FormatSinkImpl::Append(this_00,v_00);
  }
  else {
    value._M_str = local_140.data_;
    value._M_len = (size_t)CVar8.super_Storage<unsigned_long,_0UL,_false>.value;
    bVar3 = FormatSinkImpl::PutPaddedString
                      (this_00,value,(int)(len >> 0x20),conv._0_4_,(bool)(bVar2 & 1));
  }
LAB_00196f11:
  if (0x100 < (ulong)local_140.size_alloc_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                     .super_Storage<unsigned_long,_0UL,_false>.value) {
    operator_delete(local_140.data_,
                    (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value);
  }
  return bVar3;
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}